

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_connect(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  CURLcode CVar4;
  
  CVar4 = CURLE_LOGIN_DENIED;
  if (((conn->bits).field_0x5 & 1) != 0) {
    (conn->proto).smbc.state = SMB_CONNECTING;
    pvVar1 = (*Curl_cmalloc)(0x9000);
    (conn->proto).ftpc.pp.sendleft = (size_t)pvVar1;
    CVar4 = CURLE_OUT_OF_MEMORY;
    if (pvVar1 != (void *)0x0) {
      Curl_conncontrol(conn,0);
      pcVar3 = conn->user;
      pcVar2 = strchr(pcVar3,0x2f);
      if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(pcVar3,0x5c), pcVar2 == (char *)0x0)) {
        (conn->proto).ftpc.pp.cache_size = (size_t)pcVar3;
        pcVar3 = (*Curl_cstrdup)((conn->host).name);
        (conn->proto).ftpc.pp.nread_resp = (size_t)pcVar3;
        if (pcVar3 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        (conn->proto).ftpc.pp.cache_size = (size_t)(pcVar2 + 1);
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        (conn->proto).ftpc.pp.nread_resp = (size_t)pcVar3;
        if (pcVar3 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar2[(long)pcVar3 - (long)conn->user] = '\0';
      }
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode smb_connect(struct connectdata *conn, bool *done)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  char *slash;

  (void) done;

  /* Check we have a username and password to authenticate with */
  if(!conn->bits.user_passwd)
    return CURLE_LOGIN_DENIED;

  /* Initialize the connection state */
  smbc->state = SMB_CONNECTING;
  smbc->recv_buf = malloc(MAX_MESSAGE_SIZE);
  if(!smbc->recv_buf)
    return CURLE_OUT_OF_MEMORY;

  /* Multiple requests are allowed with this connection */
  connkeep(conn, "SMB default");

  /* Parse the username, domain, and password */
  slash = strchr(conn->user, '/');
  if(!slash)
    slash = strchr(conn->user, '\\');

  if(slash) {
    smbc->user = slash + 1;
    smbc->domain = strdup(conn->user);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
    smbc->domain[slash - conn->user] = 0;
  }
  else {
    smbc->user = conn->user;
    smbc->domain = strdup(conn->host.name);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}